

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::operator==
          (FundamentalParameterData *this,FundamentalParameterData *Value)

{
  if (((((((float)this->m_f32Freq == (float)Value->m_f32Freq) &&
         (!NAN((float)this->m_f32Freq) && !NAN((float)Value->m_f32Freq))) &&
        ((float)this->m_f32FreqRange == (float)Value->m_f32FreqRange)) &&
       ((!NAN((float)this->m_f32FreqRange) && !NAN((float)Value->m_f32FreqRange) &&
        ((float)this->m_f32EffectiveRadiatedPower == (float)Value->m_f32EffectiveRadiatedPower))))
      && (((!NAN((float)this->m_f32EffectiveRadiatedPower) &&
            !NAN((float)Value->m_f32EffectiveRadiatedPower) &&
           (((float)this->m_f32PulseRepetitionFreq == (float)Value->m_f32PulseRepetitionFreq &&
            (!NAN((float)this->m_f32PulseRepetitionFreq) &&
             !NAN((float)Value->m_f32PulseRepetitionFreq))))) &&
          ((float)this->m_f32PulseWidth == (float)Value->m_f32PulseWidth)))) &&
     ((((!NAN((float)this->m_f32PulseWidth) && !NAN((float)Value->m_f32PulseWidth) &&
        ((float)this->m_f32BeamAzimuthCenter == (float)Value->m_f32BeamAzimuthCenter)) &&
       (!NAN((float)this->m_f32BeamAzimuthCenter) && !NAN((float)Value->m_f32BeamAzimuthCenter))) &&
      ((((float)this->m_f32BeamAzimuthSweep == (float)Value->m_f32BeamAzimuthSweep &&
        (!NAN((float)this->m_f32BeamAzimuthSweep) && !NAN((float)Value->m_f32BeamAzimuthSweep))) &&
       (((float)this->m_f32BeamElevationCenter == (float)Value->m_f32BeamElevationCenter &&
        (!NAN((float)this->m_f32BeamElevationCenter) && !NAN((float)Value->m_f32BeamElevationCenter)
        )))))))) {
    if (((float)this->m_f32BeamElevationSweep == (float)Value->m_f32BeamElevationSweep) &&
       (!NAN((float)this->m_f32BeamElevationSweep) && !NAN((float)Value->m_f32BeamElevationSweep)))
    {
      return (KBOOL)(-((float)Value->m_f32BeamSweepSync == (float)this->m_f32BeamSweepSync) & 1);
    }
  }
  return false;
}

Assistant:

KBOOL FundamentalParameterData::operator == ( const FundamentalParameterData & Value ) const
{
    if( m_f32Freq                   != Value.m_f32Freq )                    return false;
    if( m_f32FreqRange              != Value.m_f32FreqRange )               return false;
    if( m_f32EffectiveRadiatedPower != Value.m_f32EffectiveRadiatedPower )  return false;
    if( m_f32PulseRepetitionFreq    != Value.m_f32PulseRepetitionFreq )     return false;
    if( m_f32PulseWidth             != Value.m_f32PulseWidth )              return false;
    if( m_f32BeamAzimuthCenter      != Value.m_f32BeamAzimuthCenter )       return false;
    if( m_f32BeamAzimuthSweep       != Value.m_f32BeamAzimuthSweep )        return false;
    if( m_f32BeamElevationCenter    != Value.m_f32BeamElevationCenter )     return false;
    if( m_f32BeamElevationSweep     != Value.m_f32BeamElevationSweep )      return false;
    if( m_f32BeamSweepSync          != Value.m_f32BeamSweepSync )           return false;
    return true;
}